

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O2

void __thiscall
jaegertracing::samplers::Config::Config
          (Config *this,string *type,double param,string *samplingServerURL,int maxOperations,
          duration *samplingRefreshInterval)

{
  int iVar1;
  long lVar2;
  allocator local_3a;
  allocator local_39;
  double local_38;
  
  local_38 = param;
  if (type->_M_string_length == 0) {
    std::__cxx11::string::string((string *)this,"remote",&local_39);
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)type);
  }
  this->_param = (double)(~-(ulong)(local_38 == -1.0) & (ulong)local_38 |
                         -(ulong)(local_38 == -1.0) & 0x3f50624dd2f1a9fc);
  if (samplingServerURL->_M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)&this->_samplingServerURL,"http://127.0.0.1:5778/sampling",&local_3a);
  }
  else {
    std::__cxx11::string::string((string *)&this->_samplingServerURL,(string *)samplingServerURL);
  }
  iVar1 = 2000;
  if (maxOperations != 0) {
    iVar1 = maxOperations;
  }
  this->_maxOperations = iVar1;
  lVar2 = 60000000000;
  if (0 < samplingRefreshInterval->__r) {
    lVar2 = samplingRefreshInterval->__r;
  }
  (this->_samplingRefreshInterval).__r = lVar2;
  return;
}

Assistant:

explicit Config(
        const std::string& type = kSamplerTypeRemote,
        double param = kDefaultSamplingProbability,
        const std::string& samplingServerURL = kDefaultSamplingServerURL,
        int maxOperations = kDefaultMaxOperations,
        const Clock::duration& samplingRefreshInterval =
            defaultSamplingRefreshInterval())
        : _type(type.empty() ? kSamplerTypeRemote : type)
        , _param(param == -1 ? kDefaultSamplingProbability : param)
        , _samplingServerURL(samplingServerURL.empty()
                                 ? kDefaultSamplingServerURL
                                 : samplingServerURL)
        , _maxOperations(maxOperations == 0 ? kDefaultMaxOperations
                                            : maxOperations)
        , _samplingRefreshInterval(samplingRefreshInterval.count() > 0
                                       ? samplingRefreshInterval
                                       : defaultSamplingRefreshInterval())
    {
    }